

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::rasterizePrimitive
               (RenderState *state,RenderTarget *renderTarget,Program *program,Triangle *triangle,
               IVec4 *renderTargetRect,RasterizationInternalBuffers *buffers)

{
  int primitiveID_;
  VertexPacket *pVVar1;
  VertexPacket *pVVar2;
  VertexPacket *pVVar3;
  float *fragmentDepths_;
  FragmentShader *pFVar4;
  int numSamples_00;
  FaceType visibleFace_;
  reference outputArray_;
  vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_> *this;
  size_type sVar5;
  MultisamplePixelBufferAccess *msAccess;
  reference pvVar6;
  float a;
  float fVar7;
  int local_1a8;
  int local_1a4;
  int sampleNdx_1;
  int sampleNdx;
  int numRasterizedPackets;
  int maxFragmentPackets;
  float local_170;
  float local_16c;
  float minimumResolvableDifference;
  float maximumDepthSlope;
  FragmentShadingContext shadingContext;
  FaceType visibleFace;
  float depthOffset;
  TriangleRasterizer rasterizer;
  float depthClampMax;
  float depthClampMin;
  int numSamples;
  RasterizationInternalBuffers *buffers_local;
  IVec4 *renderTargetRect_local;
  Triangle *triangle_local;
  Program *program_local;
  RenderTarget *renderTarget_local;
  RenderState *state_local;
  
  numSamples_00 = RenderTarget::getNumSamples(renderTarget);
  a = de::min<float>((state->viewport).zn,(state->viewport).zf);
  rasterizer.m_viewportOrientation =
       (ViewportOrientation)de::max<float>((state->viewport).zn,(state->viewport).zf);
  TriangleRasterizer::TriangleRasterizer
            ((TriangleRasterizer *)&visibleFace,renderTargetRect,numSamples_00,&state->rasterization
            );
  shadingContext._60_4_ = 0;
  TriangleRasterizer::init
            ((TriangleRasterizer *)&visibleFace,(EVP_PKEY_CTX *)&triangle->v0->position);
  shadingContext.visibleFace =
       TriangleRasterizer::getVisibleFace((TriangleRasterizer *)&visibleFace);
  if (((state->cullMode != CULLMODE_FRONT) || (shadingContext.visibleFace != FACETYPE_FRONT)) &&
     ((state->cullMode != CULLMODE_BACK || (shadingContext.visibleFace != FACETYPE_BACK)))) {
    pVVar1 = triangle->v0;
    pVVar2 = triangle->v1;
    pVVar3 = triangle->v2;
    outputArray_ = std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::operator[]
                             (&buffers->shaderOutputs,0);
    fragmentDepths_ = buffers->fragmentDepthBuffer;
    primitiveID_ = triangle->v2->primitiveID;
    this = FragmentShader::getOutputs(program->fragmentShader);
    sVar5 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::size(this)
    ;
    visibleFace_ = TriangleRasterizer::getVisibleFace((TriangleRasterizer *)&visibleFace);
    FragmentShadingContext::FragmentShadingContext
              ((FragmentShadingContext *)&minimumResolvableDifference,pVVar1->outputs,
               pVVar2->outputs,pVVar3->outputs,outputArray_,fragmentDepths_,primitiveID_,(int)sVar5,
               numSamples_00,visibleFace_);
    if ((buffers->fragmentDepthBuffer != (float *)0x0) &&
       (((state->fragOps).polygonOffsetEnabled & 1U) != 0)) {
      local_16c = findPrimitiveMaximumDepthSlope(triangle);
      msAccess = RenderTarget::getDepthBuffer(renderTarget);
      MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                ((MultisampleConstPixelBufferAccess *)&numRasterizedPackets,msAccess);
      local_170 = findPrimitiveMinimumResolvableDifference
                            (triangle,(MultisampleConstPixelBufferAccess *)&numRasterizedPackets);
      shadingContext._60_4_ =
           local_16c * (state->fragOps).polygonOffsetFactor +
           local_170 * (state->fragOps).polygonOffsetUnits;
    }
    while( true ) {
      sVar5 = std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::size
                        (&buffers->fragmentPackets);
      sampleNdx = (int)sVar5;
      sampleNdx_1 = 0;
      pvVar6 = std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::operator[]
                         (&buffers->fragmentPackets,0);
      TriangleRasterizer::rasterize
                ((TriangleRasterizer *)&visibleFace,pvVar6,buffers->fragmentDepthBuffer,sampleNdx,
                 &sampleNdx_1);
      if (sampleNdx_1 == 0) break;
      if ((buffers->fragmentDepthBuffer != (float *)0x0) &&
         (((state->fragOps).polygonOffsetEnabled & 1U) != 0)) {
        for (local_1a4 = 0; local_1a4 < sampleNdx_1 * 4 * numSamples_00; local_1a4 = local_1a4 + 1)
        {
          fVar7 = de::clamp<float>(buffers->fragmentDepthBuffer[local_1a4] +
                                   (float)shadingContext._60_4_,0.0,1.0);
          buffers->fragmentDepthBuffer[local_1a4] = fVar7;
        }
      }
      pFVar4 = program->fragmentShader;
      pvVar6 = std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::operator[]
                         (&buffers->fragmentPackets,0);
      (**pFVar4->_vptr_FragmentShader)
                (pFVar4,pvVar6,(ulong)(uint)sampleNdx_1,&minimumResolvableDifference);
      if ((buffers->fragmentDepthBuffer != (float *)0x0) &&
         (((state->fragOps).depthClampEnabled & 1U) != 0)) {
        for (local_1a8 = 0; local_1a8 < sampleNdx_1 * 4 * numSamples_00; local_1a8 = local_1a8 + 1)
        {
          fVar7 = de::clamp<float>(buffers->fragmentDepthBuffer[local_1a8],a,
                                   (float)rasterizer.m_viewportOrientation);
          buffers->fragmentDepthBuffer[local_1a8] = fVar7;
        }
      }
      pvVar6 = std::vector<rr::FragmentPacket,_std::allocator<rr::FragmentPacket>_>::operator[]
                         (&buffers->fragmentPackets,0);
      writeFragmentPackets
                (state,renderTarget,program,pvVar6,sampleNdx_1,shadingContext.visibleFace,
                 &buffers->shaderOutputs,buffers->fragmentDepthBuffer,&buffers->shadedFragments);
    }
  }
  return;
}

Assistant:

void rasterizePrimitive (const RenderState&					state,
						 const RenderTarget&				renderTarget,
						 const Program&						program,
						 const pa::Triangle&				triangle,
						 const tcu::IVec4&					renderTargetRect,
						 RasterizationInternalBuffers&		buffers)
{
	const int			numSamples		= renderTarget.getNumSamples();
	const float			depthClampMin	= de::min(state.viewport.zn, state.viewport.zf);
	const float			depthClampMax	= de::max(state.viewport.zn, state.viewport.zf);
	TriangleRasterizer	rasterizer		(renderTargetRect, numSamples, state.rasterization);
	float				depthOffset		= 0.0f;

	rasterizer.init(triangle.v0->position, triangle.v1->position, triangle.v2->position);

	// Culling
	const FaceType visibleFace = rasterizer.getVisibleFace();
	if ((state.cullMode == CULLMODE_FRONT	&& visibleFace == FACETYPE_FRONT) ||
		(state.cullMode == CULLMODE_BACK	&& visibleFace == FACETYPE_BACK))
		return;

	// Shading context
	FragmentShadingContext shadingContext(triangle.v0->outputs, triangle.v1->outputs, triangle.v2->outputs, &buffers.shaderOutputs[0], buffers.fragmentDepthBuffer, triangle.v2->primitiveID, (int)program.fragmentShader->getOutputs().size(), numSamples, rasterizer.getVisibleFace());

	// Polygon offset
	if (buffers.fragmentDepthBuffer && state.fragOps.polygonOffsetEnabled)
	{
		const float maximumDepthSlope			= findPrimitiveMaximumDepthSlope(triangle);
		const float minimumResolvableDifference	= findPrimitiveMinimumResolvableDifference(triangle, renderTarget.getDepthBuffer());

		depthOffset = maximumDepthSlope * state.fragOps.polygonOffsetFactor + minimumResolvableDifference * state.fragOps.polygonOffsetUnits;
	}

	// Execute rasterize - shade - write loop
	for (;;)
	{
		const int	maxFragmentPackets		= (int)buffers.fragmentPackets.size();
		int			numRasterizedPackets	= 0;

		// Rasterize

		rasterizer.rasterize(&buffers.fragmentPackets[0], buffers.fragmentDepthBuffer, maxFragmentPackets, numRasterizedPackets);

		// numRasterizedPackets is guaranteed to be greater than zero for shadeFragments()

		if (!numRasterizedPackets)
			break; // Rasterization finished.

		// Polygon offset
		if (buffers.fragmentDepthBuffer && state.fragOps.polygonOffsetEnabled)
			for (int sampleNdx = 0; sampleNdx < numRasterizedPackets * 4 * numSamples; ++sampleNdx)
				buffers.fragmentDepthBuffer[sampleNdx] = de::clamp(buffers.fragmentDepthBuffer[sampleNdx] + depthOffset, 0.0f, 1.0f);

		// Shade

		program.fragmentShader->shadeFragments(&buffers.fragmentPackets[0], numRasterizedPackets, shadingContext);

		// Depth clamp
		if (buffers.fragmentDepthBuffer && state.fragOps.depthClampEnabled)
			for (int sampleNdx = 0; sampleNdx < numRasterizedPackets * 4 * numSamples; ++sampleNdx)
				buffers.fragmentDepthBuffer[sampleNdx] = de::clamp(buffers.fragmentDepthBuffer[sampleNdx], depthClampMin, depthClampMax);

		// Handle fragment shader outputs

		writeFragmentPackets(state, renderTarget, program, &buffers.fragmentPackets[0], numRasterizedPackets, visibleFace, buffers.shaderOutputs, buffers.fragmentDepthBuffer, buffers.shadedFragments);
	}
}